

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O2

Bool prvTidytidySetLanguage(ctmbstr languageCode)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  ulong in_RAX;
  tmbstr ptVar4;
  size_t sVar5;
  __int32_t **pp_Var6;
  languageDefinition *plVar7;
  languageDefinition *plVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uStack_38;
  bool bVar13;
  
  if (languageCode == (ctmbstr)0x0) {
    return no;
  }
  uStack_38 = in_RAX;
  ptVar4 = prvTidytmbstrdup(&prvTidyg_default_allocator,languageCode);
  ptVar4 = prvTidytmbstrtolower(ptVar4);
  uVar2 = 0;
  do {
    uVar9 = uVar2;
    if (localeMappings[uVar9].winName == (char *)0x0) goto LAB_0013514b;
    iVar3 = strcmp(localeMappings[uVar9].winName,ptVar4);
    uVar2 = uVar9 + 1;
  } while (iVar3 != 0);
  (*(prvTidyg_default_allocator.vtbl)->free)(&prvTidyg_default_allocator,ptVar4);
  ptVar4 = prvTidytmbstrdup(&prvTidyg_default_allocator,localeMappings[uVar9].POSIXName);
LAB_0013514b:
  sVar5 = strlen(ptVar4);
  uVar1 = 5;
  if ((uint)sVar5 < 5) {
    uVar1 = sVar5;
  }
  for (uVar10 = 0; (uVar1 & 0xffffffff) != uVar10; uVar10 = uVar10 + 1) {
    if (uVar10 == 2) {
      if ((uint)sVar5 < 5) {
        DAT_001ede8a = 0;
        break;
      }
      DAT_001ede8a = 0x5f;
    }
    else {
      pp_Var6 = __ctype_tolower_loc();
      (&prvTidytidyNormalizedLocaleName_result)[uVar10] = (char)(*pp_Var6)[ptVar4[uVar10]];
    }
  }
  (*(prvTidyg_default_allocator.vtbl)->free)(&prvTidyg_default_allocator,ptVar4);
  plVar7 = prvTidytidyTestLanguage(&prvTidytidyNormalizedLocaleName_result);
  sVar5 = strlen(&prvTidytidyNormalizedLocaleName_result);
  if (sVar5 < 3) {
    bVar11 = false;
    plVar8 = (languageDefinition *)0x0;
LAB_00135238:
    bVar13 = plVar7 != (languageDefinition *)0x0;
    bVar12 = plVar7 == (languageDefinition *)0x0;
    if (bVar12 || bVar11 != false) goto LAB_0013524a;
  }
  else {
    strncpy((char *)((long)&uStack_38 + 5),&prvTidytidyNormalizedLocaleName_result,2);
    uStack_38 = uStack_38 & 0xffffffffffffff;
    plVar8 = prvTidytidyTestLanguage((char *)((long)&uStack_38 + 5));
    bVar11 = plVar8 != (languageDefinition *)0x0;
    if (plVar7 == (languageDefinition *)0x0 || !bVar11) goto LAB_00135238;
    bVar13 = true;
    bVar12 = false;
    bVar11 = true;
    tidyLanguages.currentLanguage = plVar7;
    tidyLanguages.fallbackLanguage = plVar8;
LAB_0013524a:
    plVar7 = plVar8;
    if (!(bool)(bVar12 & bVar11)) goto LAB_00135265;
  }
  tidyLanguages.fallbackLanguage = (languageDefinition *)0x0;
  tidyLanguages.currentLanguage = plVar7;
LAB_00135265:
  return (uint)(byte)(bVar13 | bVar11);
}

Assistant:

TY_PRIVATE Bool TY_(tidySetLanguage)( ctmbstr languageCode )
{
    languageDefinition *dict1 = NULL;
    languageDefinition *dict2 = NULL;
    tmbstr wantCode = NULL;
    char lang[3] = "";
    
    if ( !languageCode || !(wantCode = TY_(tidyNormalizedLocaleName)( languageCode )) )
    {
        return no;
    }
    
    /* We want to use the specified language as the currentLanguage, and set
     fallback language as necessary. We have either a two or five digit code,
     either or both of which might be installed. Let's test both of them:
     */
    
    dict1 = TY_(tidyTestLanguage( wantCode ));  /* WANTED language */
    
    if ( strlen( wantCode ) > 2 )
    {
        strncpy(lang, wantCode, 2);
        lang[2] = '\0';
        dict2 = TY_(tidyTestLanguage( lang ) ); /* BACKUP language? */
    }
    
    if ( dict1 && dict2 )
    {
        tidyLanguages.currentLanguage = dict1;
        tidyLanguages.fallbackLanguage = dict2;
    }
    if ( dict1 && !dict2 )
    {
        tidyLanguages.currentLanguage = dict1;
        tidyLanguages.fallbackLanguage = NULL;
    }
    if ( !dict1 && dict2 )
    {
        tidyLanguages.currentLanguage = dict2;
        tidyLanguages.fallbackLanguage = NULL;
    }
    if ( !dict1 && !dict2 )
    {
        /* No change. */
    }
    
    return dict1 || dict2;
}